

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void tty_get(void)

{
  ssize_t sVar1;
  char local_108 [8];
  char indata [256];
  
  if ((-1 < TTY_Fd) && (((uint)*DLTTYIn & 1) == 0)) {
    DLTTYIn->in_data = '\0';
    sVar1 = read(TTY_Fd,local_108,1);
    if (sVar1 == 1) {
      DLTTYIn->in_data = local_108[0];
      *(ushort *)DLTTYIn = *(ushort *)DLTTYIn & 0xfffe | 1;
    }
    else {
      error("TTY: tty_get");
    }
  }
  return;
}

Assistant:

void tty_get(void)
{
  char indata[256];

  if ((TTY_Fd >= 0) && !DLTTYIn->state) {
    DLTTYIn->in_data = '\0'; /* Clear Previous Data */

    if (read(TTY_Fd, indata, 1) == 1) {
      DLTTYIn->in_data = indata[0];
      DLTTYIn->state = 1;
    } else {
      error("TTY: tty_get");
    }
  }
}